

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec_utils.c
# Opt level: O0

stream * init_stream(uint16_t size)

{
  long lVar1;
  stream *psVar2;
  uint8_t *puVar3;
  long in_FS_OFFSET;
  stream *s;
  uint16_t size_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  psVar2 = (stream *)lrtr_calloc(0x20,1);
  puVar3 = (uint8_t *)lrtr_calloc((ulong)size,1);
  psVar2->stream = puVar3;
  psVar2->start = psVar2->stream;
  psVar2->size = (ulong)size;
  psVar2->w_head = 0;
  psVar2->r_head = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return psVar2;
  }
  __stack_chk_fail();
}

Assistant:

struct stream *init_stream(uint16_t size)
{
	struct stream *s = lrtr_calloc(sizeof(struct stream), 1);

	s->stream = lrtr_calloc(size, 1);
	s->start = s->stream;
	s->size = size;
	s->w_head = 0;
	s->r_head = 0;
	return s;
}